

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O0

bool * __thiscall
SmallDenseMap<unsigned_int,_bool,_SmallDenseMapUnsignedHasher,_128U>::find
          (SmallDenseMap<unsigned_int,_bool,_SmallDenseMapUnsignedHasher,_128U> *this,uint *key)

{
  uint uVar1;
  Node *pNVar2;
  Node *item;
  uint i;
  uint local_24;
  uint bucket;
  uint bucketMask;
  uint *key_local;
  SmallDenseMap<unsigned_int,_bool,_SmallDenseMapUnsignedHasher,_128U> *this_local;
  
  local_24 = this->bucketCount - 1;
  _bucket = key;
  key_local = &this->bucketCount;
  uVar1 = SmallDenseMapUnsignedHasher::operator()
                    ((SmallDenseMapUnsignedHasher *)((long)&item + 7),*key);
  item._0_4_ = 0;
  while( true ) {
    i = uVar1 & local_24;
    if (this->bucketCount <= (uint)item) {
      return (bool *)0x0;
    }
    pNVar2 = this->data + i;
    if (pNVar2->key == 0) break;
    if (pNVar2->key == *_bucket) {
      return &pNVar2->value;
    }
    uVar1 = i + (uint)item + 1;
    item._0_4_ = (uint)item + 1;
  }
  return (bool *)0x0;
}

Assistant:

Value* find(const Key& key) const
	{
		unsigned bucketMask = bucketCount - 1;
		unsigned bucket = Hasher()(key) & bucketMask;

		for(unsigned i = 0; i < bucketCount; i++)
		{
			Node &item = data[bucket];

			if(item.key == Key())
				return NULL;

			if(item.key == key)
				return &item.value;

			// Quadratic probing
			bucket = (bucket + i + 1) & bucketMask;
		}

		return NULL;
	}